

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmLocalGenerator *this_00;
  undefined8 this_01;
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  cmMakefile *pcVar4;
  string *psVar5;
  string *psVar6;
  ostream *poVar7;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_02;
  reference ppcVar8;
  reference ppcVar9;
  char *pcVar10;
  long lVar11;
  reference target_00;
  string *f;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string fastTarget;
  string local_198;
  char *local_178;
  char *editCommand;
  string *psStack_168;
  bool insertTarget;
  string *targetName;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  undefined1 local_138 [7];
  bool topLevel;
  string currentDir;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  cmLocalGenerator *localGen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string *local_a0;
  string *homeOutputDir;
  string local_90;
  string *local_70;
  string *makeArgs;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *make;
  cmMakefile *mf;
  cmGeneratedFileStream *fout_local;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  mf = (cmMakefile *)fout;
  fout_local = (cmGeneratedFileStream *)lg;
  lg_local = (cmLocalGenerator *)this;
  pcVar4 = cmLocalGenerator::GetMakefile(lg);
  make = (string *)pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_MAKE_PROGRAM",&local_51);
  psVar5 = cmMakefile::GetRequiredDefinition(pcVar4,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  psVar6 = make;
  local_30 = psVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_KATE_MAKE_ARGUMENTS",
             (allocator<char> *)((long)&homeOutputDir + 7));
  psVar6 = cmMakefile::GetSafeDefinition((cmMakefile *)psVar6,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&homeOutputDir + 7));
  local_70 = psVar6;
  local_a0 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)fout_local);
  poVar7 = std::operator<<((ostream *)mf,"\t\"build\": {\n\t\t\"directory\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  std::operator<<(poVar7,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar7 = std::operator<<((ostream *)mf,"\t\t\"build\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_30);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)local_70);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"all\",\n");
  poVar7 = std::operator<<((ostream *)mf,"\t\t\"clean\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_30);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)local_70);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"clean\",\n");
  poVar7 = std::operator<<((ostream *)mf,"\t\t\"quick\": \"");
  poVar7 = std::operator<<(poVar7,(string *)local_30);
  poVar7 = std::operator<<(poVar7," -C \\\"");
  poVar7 = std::operator<<(poVar7,(string *)local_a0);
  poVar7 = std::operator<<(poVar7,"\\\" ");
  poVar7 = std::operator<<(poVar7,(string *)local_70);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,"install\",\n");
  std::operator<<((ostream *)mf,"\t\t\"targets\":[\n");
  pcVar4 = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"all",&local_c1);
  AppendTarget(this,(cmGeneratedFileStream *)pcVar4,&local_c0,local_30,local_70,local_a0,local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar4 = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"clean",(allocator<char> *)((long)&__range1 + 7));
  AppendTarget(this,(cmGeneratedFileStream *)pcVar4,&local_e8,local_30,local_70,local_a0,local_a0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this_02 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_02);
  localGen = (cmLocalGenerator *)
             std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&localGen), bVar1) {
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar8;
    currentDir.field_2._8_8_ = cmLocalGenerator::GetGeneratorTargets(this_00);
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)local_138,(string *)psVar6);
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138,psVar6);
    this_01 = currentDir.field_2._8_8_;
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                       ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                        currentDir.field_2._8_8_);
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                       ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)this_01
                       );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&target), bVar1) {
      ppcVar9 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      targetName = (string *)*ppcVar9;
      psStack_168 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)targetName);
      TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)targetName);
      if (TVar3 < UTILITY) {
        AppendTarget(this,(cmGeneratedFileStream *)mf,psStack_168,local_30,local_70,
                     (string *)local_138,local_a0);
        std::__cxx11::string::string
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psStack_168);
        std::__cxx11::string::operator+=
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"/fast");
        AppendTarget(this,(cmGeneratedFileStream *)mf,
                     (string *)
                     &objectFileTargets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_30,local_70,
                     (string *)local_138,local_a0);
        std::__cxx11::string::~string
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if (TVar3 == UTILITY) {
        lVar11 = std::__cxx11::string::find((char *)psStack_168,0x799c7a);
        if ((((lVar11 != 0) || (bVar1 = std::operator!=(psStack_168,"Nightly"), !bVar1)) &&
            ((lVar11 = std::__cxx11::string::find((char *)psStack_168,0x799c82), lVar11 != 0 ||
             (bVar1 = std::operator!=(psStack_168,"Continuous"), !bVar1)))) &&
           ((lVar11 = std::__cxx11::string::find((char *)psStack_168,0x799c8d), lVar11 != 0 ||
            (bVar1 = std::operator!=(psStack_168,"Experimental"), !bVar1)))) {
          AppendTarget(this,(cmGeneratedFileStream *)mf,psStack_168,local_30,local_70,
                       (string *)local_138,local_a0);
        }
      }
      else if (TVar3 == GLOBAL_TARGET) {
        editCommand._7_1_ = 0;
        if (_Var2) {
          editCommand._7_1_ = 1;
          bVar1 = std::operator==(psStack_168,"edit_cache");
          if (bVar1) {
            pcVar4 = cmLocalGenerator::GetMakefile(this_00);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_198,"CMAKE_EDIT_COMMAND",
                       (allocator<char> *)(fastTarget.field_2._M_local_buf + 0xf));
            pcVar10 = cmMakefile::GetDefinition(pcVar4,&local_198);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(fastTarget.field_2._M_local_buf + 0xf));
            local_178 = pcVar10;
            if (pcVar10 == (char *)0x0) {
              editCommand._7_1_ = 0;
            }
            else {
              pcVar10 = strstr(pcVar10,"ccmake");
              if (pcVar10 != (char *)0x0) {
                editCommand._7_1_ = 0;
              }
            }
          }
        }
        if ((editCommand._7_1_ & 1) != 0) {
          AppendTarget(this,(cmGeneratedFileStream *)mf,psStack_168,local_30,local_70,
                       (string *)local_138,local_a0);
        }
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2_1);
    cmLocalGenerator::GetIndividualFileTargets
              (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
    f = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&f), bVar1) {
      target_00 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      AppendTarget(this,(cmGeneratedFileStream *)mf,target_00,local_30,local_70,(string *)local_138,
                   local_a0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_1);
    std::__cxx11::string::~string((string *)local_138);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)mf,"\t] }\n");
  return;
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator* lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg->GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg->GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* localGen :
       this->GlobalGenerator->GetLocalGenerators()) {
    const std::vector<cmGeneratorTarget*>& targets =
      localGen->GetGeneratorTargets();
    std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (cmGeneratorTarget* target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              const char* editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (editCommand == nullptr) {
                insertTarget = false;
              } else if (strstr(editCommand, "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, make, makeArgs, currentDir, homeOutputDir);
    }
  }

  fout << "\t] }\n";
}